

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

void __thiscall bgui::FileImageWindow::saveContent(FileImageWindow *this,char *basename)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  ImageIO *this_00;
  long w;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong x;
  ulong y;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_118;
  string name;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&local_118,0,0,1);
  BaseWindow::getContent((BaseWindow *)this,&local_118);
  lVar4 = local_118.height;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < local_118.height) {
    uVar8 = local_118.height;
  }
  while ((y = uVar8, uVar8 != uVar6 &&
         (bVar3 = anon_unknown_8::isImageRowEmpty(&local_118,uVar6), y = uVar6, bVar3))) {
    uVar6 = uVar6 + 1;
  }
  uVar8 = lVar4;
  do {
    uVar6 = lVar4 >> 0x3f & lVar4;
    if ((long)uVar8 < 1) break;
    bVar3 = anon_unknown_8::isImageRowEmpty(&local_118,uVar8 - 1);
    uVar6 = uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar3);
  lVar2 = local_118.width;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < local_118.width) {
    uVar8 = local_118.width;
  }
  while ((x = uVar8, uVar8 != uVar7 &&
         (bVar3 = anon_unknown_8::isImageColumnEmpty(&local_118,uVar7), x = uVar7, bVar3))) {
    uVar7 = uVar7 + 1;
  }
  uVar8 = lVar2;
  do {
    uVar7 = lVar2 >> 0x3f & lVar2;
    if ((long)uVar8 < 1) break;
    bVar3 = anon_unknown_8::isImageColumnEmpty(&local_118,uVar8 - 1);
    uVar7 = uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar3);
  lVar5 = uVar6 - y;
  if ((lVar5 == 0 || (long)uVar6 < (long)y) || (w = uVar7 - x, w == 0 || (long)uVar7 < (long)x)) {
    BaseWindow::setInfoLine((BaseWindow *)this,"Empty image!",true,true);
  }
  else {
    if (((x != 0 || y != 0) || (w < lVar2)) || (lVar5 < lVar4)) {
      gimage::cropImage<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&base,&local_118,x,y,w
                 ,lVar5);
      lVar5 = local_118.n;
      lVar2 = local_118.height;
      lVar4 = local_118.width;
      iVar1 = local_118.depth;
      local_118.depth = (int)base._M_dataplus._M_p;
      base._M_dataplus._M_p._0_4_ = iVar1;
      local_118.width = base._M_string_length;
      local_118.height = base.field_2._M_allocated_capacity;
      base._M_string_length = lVar4;
      base.field_2._M_allocated_capacity = lVar2;
      local_118.n = base.field_2._8_8_;
      base.field_2._8_8_ = lVar5;
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&base);
    }
    std::__cxx11::string::string((string *)&base,basename,(allocator *)&name);
    lVar4 = std::__cxx11::string::rfind((char)&base,0x2e);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&name,(ulong)&base);
      std::__cxx11::string::operator=((string *)&base,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&base);
    gimage::getNewImageName(&name,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (name._M_string_length == 0) {
      BaseWindow::setInfoLine
                ((BaseWindow *)this,"Sorry, cannot determine file name for storing image!",true,true
                );
    }
    else {
      this_00 = gimage::getImageIO();
      gimage::ImageIO::save(this_00,&local_118,name._M_dataplus._M_p);
      std::operator+(&local_70,"Saved as ",&name);
      BaseWindow::setInfoLine((BaseWindow *)this,local_70._M_dataplus._M_p,true,true);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&base);
  }
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_118);
  return;
}

Assistant:

void FileImageWindow::saveContent(const char *basename)
{
  gimage::ImageU8 image;

  getContent(image);

  // strip black borders from image

  long k0=0;

  while (k0 < image.getHeight() && isImageRowEmpty(image, k0))
  {
    k0++;
  }

  long k1=image.getHeight()-1;

  while (k1 >= 0 && isImageRowEmpty(image, k1))
  {
    k1--;
  }

  long i0=0;

  while (i0 < image.getWidth() && isImageColumnEmpty(image, i0))
  {
    i0++;
  }

  long i1=image.getWidth()-1;

  while (i1 >= 0 && isImageColumnEmpty(image, i1))
  {
    i1--;
  }

  if (i0 <= i1 && k0 <= k1)
  {
    if (i0 > 0 || k0 > 0 || i1-i0+1 < image.getWidth() ||
        k1-k0+1 < image.getHeight())
    {
      image=cropImage(image, i0, k0, i1-i0+1, k1-k0+1);
    }

    // find file name that is not used

    std::string base=basename;

    size_t i=base.rfind('.');

    if (i != base.npos)
    {
      base=base.substr(0, i);
    }

    std::string name=gimage::getNewImageName(base);

    if (name.size() > 0)
    {
      gimage::getImageIO().save(image, name.c_str());
      setInfoLine(("Saved as "+name).c_str());
    }
    else
    {
      setInfoLine("Sorry, cannot determine file name for storing image!");
    }
  }
  else
  {
    setInfoLine("Empty image!");
  }
}